

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnvbocu.cpp
# Opt level: O0

int32_t packDiff(int32_t diff)

{
  int iVar1;
  int iVar2;
  int local_44;
  int local_40;
  uint local_3c;
  int local_38;
  uint local_34;
  uint local_30;
  int local_2c;
  int local_28;
  uint local_24;
  int local_20;
  uint local_1c;
  uint local_18;
  int local_14;
  uint local_10;
  int32_t m;
  int32_t result;
  int32_t diff_local;
  
  if (diff < -0x40) {
    if (diff < -0x2911) {
      if (diff < -0x2dd0c) {
        local_14 = (diff + 0x2dd0c) % 0xf3;
        m = (diff + 0x2dd0c) / 0xf3;
        if (local_14 < 0) {
          m = m + -1;
          local_14 = local_14 + 0xf3;
        }
        if (local_14 < 0x14) {
          local_3c = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                           [local_14];
        }
        else {
          local_3c = local_14 + 0xd;
        }
        local_14 = m % 0xf3;
        m = m / 0xf3;
        if (local_14 < 0) {
          m = m + -1;
          local_14 = local_14 + 0xf3;
        }
        if (local_14 < 0x14) {
          local_40 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                          [local_14];
        }
        else {
          local_40 = local_14 + 0xd;
        }
        if (m + 0xf3 < 0x14) {
          local_44 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                          [m + 0xf3];
        }
        else {
          local_44 = m + 0x100;
        }
        local_10 = local_44 << 0x10 | local_40 << 8 | local_3c | 0x21000000;
      }
      else {
        local_14 = (diff + 0x2911) % 0xf3;
        m = (diff + 0x2911) / 0xf3;
        if (local_14 < 0) {
          m = m + -1;
          local_14 = local_14 + 0xf3;
        }
        if (local_14 < 0x14) {
          local_34 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                           [local_14];
        }
        else {
          local_34 = local_14 + 0xd;
        }
        local_14 = m % 0xf3;
        m = m / 0xf3;
        if (local_14 < 0) {
          m = m + -1;
          local_14 = local_14 + 0xf3;
        }
        if (local_14 < 0x14) {
          local_38 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                          [local_14];
        }
        else {
          local_38 = local_14 + 0xd;
        }
        local_10 = (m + 0x25) * 0x10000 | local_38 << 8 | local_34 | 0x3000000;
      }
    }
    else {
      local_14 = (diff + 0x40) % 0xf3;
      m = (diff + 0x40) / 0xf3;
      if (local_14 < 0) {
        m = m + -1;
        local_14 = local_14 + 0xf3;
      }
      if (local_14 < 0x14) {
        local_30 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                         [local_14];
      }
      else {
        local_30 = local_14 + 0xd;
      }
      local_10 = (m + 0x50) * 0x100 | local_30 | 0x2000000;
    }
  }
  else if (diff < 0x2911) {
    iVar1 = (diff + -0x40) % 0xf3;
    if (iVar1 < 0x14) {
      local_18 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                       [iVar1];
    }
    else {
      local_18 = iVar1 + 0xd;
    }
    local_10 = ((diff + -0x40) / 0xf3 + 0xd0) * 0x100 | local_18 | 0x2000000;
  }
  else if (diff < 0x2dd0c) {
    iVar2 = (diff + -0x2911) % 0xf3;
    iVar1 = (diff + -0x2911) / 0xf3;
    if (iVar2 < 0x14) {
      local_1c = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                       [iVar2];
    }
    else {
      local_1c = iVar2 + 0xd;
    }
    local_20 = iVar1 % 0xf3;
    if (local_20 < 0x14) {
      local_20 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                      [local_20];
    }
    else {
      local_20 = local_20 + 0xd;
    }
    local_10 = (iVar1 / 0xf3 + 0xfb) * 0x10000 | local_20 << 8 | local_1c | 0x3000000;
  }
  else {
    iVar1 = (diff + -0x2dd0c) % 0xf3;
    local_2c = (diff + -0x2dd0c) / 0xf3;
    if (iVar1 < 0x14) {
      local_24 = (uint)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                       [iVar1];
    }
    else {
      local_24 = iVar1 + 0xd;
    }
    local_28 = local_2c % 0xf3;
    local_2c = local_2c / 0xf3;
    if (local_28 < 0x14) {
      local_28 = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                      [local_28];
    }
    else {
      local_28 = local_28 + 0xd;
    }
    if (local_2c < 0x14) {
      local_2c = (int)"\x01\x02\x03\x04\x05\x06\x10\x11\x12\x13\x14\x15\x16\x17\x18\x19\x1c\x1d\x1e\x1f"
                      [local_2c];
    }
    else {
      local_2c = local_2c + 0xd;
    }
    local_10 = local_2c << 0x10 | local_28 << 8 | local_24 | 0xfe000000;
  }
  return local_10;
}

Assistant:

static int32_t
packDiff(int32_t diff) {
    int32_t result, m;

    U_ASSERT(!DIFF_IS_SINGLE(diff)); /* assume we won't be called where diff==BOCU1_REACH_NEG_1=-64 */
    if(diff>=BOCU1_REACH_NEG_1) {
        /* mostly positive differences, and single-byte negative ones */
#if 0   /* single-byte case handled in macros, see below */
        if(diff<=BOCU1_REACH_POS_1) {
            /* single byte */
            return 0x01000000|(BOCU1_MIDDLE+diff);
        } else
#endif
        if(diff<=BOCU1_REACH_POS_2) {
            /* two bytes */
            diff-=BOCU1_REACH_POS_1+1;
            result=0x02000000;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m);

            result|=(BOCU1_START_POS_2+diff)<<8;
        } else if(diff<=BOCU1_REACH_POS_3) {
            /* three bytes */
            diff-=BOCU1_REACH_POS_2+1;
            result=0x03000000;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m);

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            result|=(BOCU1_START_POS_3+diff)<<16;
        } else {
            /* four bytes */
            diff-=BOCU1_REACH_POS_3+1;

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result=BOCU1_TRAIL_TO_BYTE(m);

            m=diff%BOCU1_TRAIL_COUNT;
            diff/=BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            /*
             * We know that / and % would deliver quotient 0 and rest=diff.
             * Avoid division and modulo for performance.
             */
            result|=BOCU1_TRAIL_TO_BYTE(diff)<<16;

            result|=((uint32_t)BOCU1_START_POS_4)<<24;
        }
    } else {
        /* two- to four-byte negative differences */
        if(diff>=BOCU1_REACH_NEG_2) {
            /* two bytes */
            diff-=BOCU1_REACH_NEG_1;
            result=0x02000000;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m);

            result|=(BOCU1_START_NEG_2+diff)<<8;
        } else if(diff>=BOCU1_REACH_NEG_3) {
            /* three bytes */
            diff-=BOCU1_REACH_NEG_2;
            result=0x03000000;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m);

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            result|=(BOCU1_START_NEG_3+diff)<<16;
        } else {
            /* four bytes */
            diff-=BOCU1_REACH_NEG_3;

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result=BOCU1_TRAIL_TO_BYTE(m);

            NEGDIVMOD(diff, BOCU1_TRAIL_COUNT, m);
            result|=BOCU1_TRAIL_TO_BYTE(m)<<8;

            /*
             * We know that NEGDIVMOD would deliver
             * quotient -1 and rest=diff+BOCU1_TRAIL_COUNT.
             * Avoid division and modulo for performance.
             */
            m=diff+BOCU1_TRAIL_COUNT;
            result|=BOCU1_TRAIL_TO_BYTE(m)<<16;

            result|=BOCU1_MIN<<24;
        }
    }
    return result;
}